

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnyDistributionEdgeCalculator.cpp
# Opt level: O0

int __thiscall
AnyDistributionEdgeCalculator::computeAllowableInsertSizeDiff(AnyDistributionEdgeCalculator *this)

{
  double dVar1;
  double dVar2;
  code *pcVar3;
  size_type sVar4;
  reference pvVar5;
  long in_RDI;
  int k;
  int i_1;
  size_t j;
  size_t i;
  vector<double,_std::allocator<double>_> diff_dist;
  size_type in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  int iVar6;
  allocator_type *in_stack_ffffffffffffff38;
  value_type vVar7;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff40;
  size_type in_stack_ffffffffffffff48;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff50;
  int local_58;
  int local_54;
  ulong local_50;
  ulong local_48;
  vector<double,_std::allocator<double>_> local_20;
  
  std::vector<double,_std::allocator<double>_>::size
            (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x18));
  std::allocator<double>::allocator((allocator<double> *)0x27b8eb);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
             (value_type_conflict4 *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  std::allocator<double>::~allocator((allocator<double> *)0x27b919);
  local_48 = 0;
  while( true ) {
    sVar4 = std::vector<double,_std::allocator<double>_>::size
                      (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x18));
    if (sVar4 <= local_48) break;
    pvVar5 = std::vector<double,_std::allocator<double>_>::at
                       ((vector<double,_std::allocator<double>_> *)
                        CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                        in_stack_ffffffffffffff28);
    dVar1 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::at
                       ((vector<double,_std::allocator<double>_> *)
                        CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                        in_stack_ffffffffffffff28);
    dVar2 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&local_20,0);
    *pvVar5 = dVar1 * dVar2 + *pvVar5;
    local_50 = local_48;
    while( true ) {
      local_50 = local_50 + 1;
      sVar4 = std::vector<double,_std::allocator<double>_>::size
                        (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x18));
      if (sVar4 <= local_50) break;
      pvVar5 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)
                          CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                          in_stack_ffffffffffffff28);
      vVar7 = *pvVar5;
      pvVar5 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)
                          CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                          in_stack_ffffffffffffff28);
      in_stack_ffffffffffffff40 = (vector<double,_std::allocator<double>_> *)(vVar7 * *pvVar5);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&local_20,local_50 - local_48);
      *pvVar5 = (double)in_stack_ffffffffffffff40 + (double)in_stack_ffffffffffffff40 + *pvVar5;
    }
    local_48 = local_48 + 1;
  }
  sVar4 = std::vector<double,_std::allocator<double>_>::size(&local_20);
  for (local_54 = (int)sVar4 + -2; -1 < local_54; local_54 = local_54 + -1) {
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&local_20,(long)(local_54 + 1));
    vVar7 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&local_20,(long)local_54);
    *pvVar5 = vVar7 + *pvVar5;
  }
  local_58 = 1;
  while( true ) {
    iVar6 = local_58;
    sVar4 = std::vector<double,_std::allocator<double>_>::size(&local_20);
    if ((int)sVar4 <= iVar6) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&local_20,(long)local_58);
    if (*pvVar5 < *(double *)(in_RDI + 8)) break;
    local_58 = local_58 + 1;
  }
  local_58 = local_58 + -1;
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffff40);
  return local_58;
}

Assistant:

int AnyDistributionEdgeCalculator::computeAllowableInsertSizeDiff() {
	// first compute distribution of (absolute) differences of two independently sampled insert lengths
	vector<double> diff_dist(2*insert_size_dist->size(), 0.0);
	for (size_t i=0; i<insert_size_dist->size(); ++i) {
		diff_dist[0] += insert_size_dist->at(i) * insert_size_dist->at(i);
		for (size_t j=i+1; j<insert_size_dist->size(); ++j) {
			diff_dist[j-i] += 2 * (insert_size_dist->at(i) * insert_size_dist->at(j));
		}
	}
	// compute right-cumulative distribution
	for (int i=diff_dist.size()-2; i>=0; --i) {
		diff_dist[i] += diff_dist[i+1];
	}
	// determine largest difference k such that P(diff >= k) >= significance_level
	for (int k=1; k < (int)diff_dist.size(); ++k) {
		if (diff_dist[k] < significance_level) return k-1;
	}
	assert(false);
}